

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

bool __thiscall
QTableWidget::dropMimeData(QTableWidget *this,int row,int column,QMimeData *data,DropAction action)

{
  byte bVar1;
  DropIndicatorPosition DVar2;
  QAbstractItemModel *pQVar3;
  QTableModel *pQVar4;
  DropAction in_ECX;
  uint in_EDX;
  int in_ESI;
  int in_R8D;
  long in_FS_OFFSET;
  QModelIndex idx;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint local_60;
  int local_5c;
  undefined1 local_50 [24];
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::QModelIndex((QModelIndex *)0x8dc921);
  DVar2 = QAbstractItemView::dropIndicatorPosition
                    ((QAbstractItemView *)
                     CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  local_60 = in_EDX;
  local_5c = in_ESI;
  if (DVar2 == OnItem) {
    pQVar3 = QAbstractItemView::model
                       ((QAbstractItemView *)
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    QModelIndex::QModelIndex((QModelIndex *)0x8dc959);
    (**(code **)(*(long *)pQVar3 + 0x60))(&local_38,pQVar3,in_ESI,in_EDX,local_50);
    local_20 = local_38;
    local_18 = local_30;
    local_10 = local_28;
    local_5c = -1;
    local_60 = 0xffffffff;
  }
  d_func((QTableWidget *)0x8dc9b4);
  pQVar4 = QTableWidgetPrivate::tableModel((QTableWidgetPrivate *)0x8dc9bc);
  bVar1 = QAbstractTableModel::dropMimeData
                    ((QMimeData *)pQVar4,in_ECX,in_R8D,local_5c,(QModelIndex *)(ulong)local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QTableWidget::dropMimeData(int row, int column, const QMimeData *data, Qt::DropAction action)
{
    QModelIndex idx;
#if QT_CONFIG(draganddrop)
    if (dropIndicatorPosition() == QAbstractItemView::OnItem) {
        // QAbstractTableModel::dropMimeData will overwrite on the index if row == -1 and column == -1
        idx = model()->index(row, column);
        row = -1;
        column = -1;
    }
#endif
    return d_func()->tableModel()->QAbstractTableModel::dropMimeData(data, action , row, column, idx);
}